

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::GridDataType1::Decode(GridDataType1 *this,KDataStream *stream)

{
  ushort uVar1;
  pointer puVar2;
  iterator __position;
  KUINT16 KVar3;
  KException *this_00;
  ushort uVar4;
  KUINT16 tmp;
  KString local_50;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  if (0xd < KVar3) {
    puVar2 = (this->m_vui16Values).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    GridData::Decode(&this->super_GridData,stream);
    KDataStream::Read<float>(stream,(float *)&(this->super_GridData).field_0xc);
    KDataStream::Read<float>(stream,(float *)&this->m_f32FieldOffset);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumValues);
    local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffff0000;
    if (this->m_ui16NumValues != 0) {
      uVar4 = 0;
      do {
        KDataStream::Read<unsigned_short>(stream,(unsigned_short *)&local_50);
        __position._M_current =
             (this->m_vui16Values).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vui16Values).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vui16Values,
                     __position,(unsigned_short *)&local_50);
        }
        else {
          *__position._M_current = (unsigned_short)local_50._M_dataplus._M_p;
          (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar4 = uVar4 + 1;
        uVar1 = this->m_ui16NumValues;
      } while (uVar4 < uVar1);
      if ((uVar1 & 1) != 0) {
        KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
      }
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
  KException::KException(this_00,&local_50,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GridDataType1::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_DATA_TYPE1_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui16Values.clear();

    GridData::Decode( stream );

    stream >> m_f32FieldScale
           >> m_f32FieldOffset
           >> m_ui16NumValues;

    KUINT16 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vui16Values.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumValues % 2 == 1 )
    {
        stream >> m_ui16Padding;
    }
}